

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlRegExecCtxtPtr xmlRelaxNGElemPop(xmlRelaxNGValidCtxtPtr ctxt)

{
  xmlRegExecCtxtPtr pxVar1;
  uint uVar2;
  xmlRegExecCtxtPtr pxVar3;
  
  if (0 < ctxt->elemNr) {
    uVar2 = ctxt->elemNr - 1;
    ctxt->elemNr = uVar2;
    pxVar1 = ctxt->elemTab[uVar2];
    ctxt->elemTab[uVar2] = (xmlRegExecCtxtPtr)0x0;
    if (uVar2 == 0) {
      pxVar3 = (xmlRegExecCtxtPtr)0x0;
    }
    else {
      pxVar3 = ctxt->elemTab[(ulong)uVar2 - 1];
    }
    ctxt->elem = pxVar3;
    return pxVar1;
  }
  return (xmlRegExecCtxtPtr)0x0;
}

Assistant:

static xmlRegExecCtxtPtr
xmlRelaxNGElemPop(xmlRelaxNGValidCtxtPtr ctxt)
{
    xmlRegExecCtxtPtr ret;

    if (ctxt->elemNr <= 0)
        return (NULL);
    ctxt->elemNr--;
    ret = ctxt->elemTab[ctxt->elemNr];
    ctxt->elemTab[ctxt->elemNr] = NULL;
    if (ctxt->elemNr > 0)
        ctxt->elem = ctxt->elemTab[ctxt->elemNr - 1];
    else
        ctxt->elem = NULL;
    return (ret);
}